

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldFPScalarDivideByZero
          (Type *result_type,Constant *numerator,ConstantManager *const_mgr)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar3;
  Type *local_30;
  Constant *result;
  ConstantManager *const_mgr_local;
  Constant *numerator_local;
  Type *result_type_local;
  
  if (numerator == (Constant *)0x0) {
    result_type_local = (Type *)0x0;
  }
  else {
    uVar1 = (*numerator->_vptr_Constant[0x17])();
    if ((uVar1 & 1) == 0) {
      local_30 = (Type *)GetInf(result_type,const_mgr);
      if (local_30 == (Type *)0x0) {
        result_type_local = (Type *)0x0;
      }
      else {
        iVar2 = (*numerator->_vptr_Constant[0xf])();
        dVar3 = analysis::Constant::GetValueAsDouble((Constant *)CONCAT44(extraout_var,iVar2));
        if (dVar3 < 0.0) {
          local_30 = (Type *)NegateFPConst(result_type,(Constant *)local_30,const_mgr);
        }
        result_type_local = local_30;
      }
    }
    else {
      result_type_local = (Type *)GetNan(result_type,const_mgr);
    }
  }
  return (Constant *)result_type_local;
}

Assistant:

const analysis::Constant* FoldFPScalarDivideByZero(
    const analysis::Type* result_type, const analysis::Constant* numerator,
    analysis::ConstantManager* const_mgr) {
  if (numerator == nullptr) {
    return nullptr;
  }

  if (numerator->IsZero()) {
    return GetNan(result_type, const_mgr);
  }

  const analysis::Constant* result = GetInf(result_type, const_mgr);
  if (result == nullptr) {
    return nullptr;
  }

  if (numerator->AsFloatConstant()->GetValueAsDouble() < 0.0) {
    result = NegateFPConst(result_type, result, const_mgr);
  }
  return result;
}